

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

laszip_I32 laszip_open_writer(laszip_POINTER pointer,laszip_CHAR *file_name,laszip_BOOL compress)

{
  undefined8 uVar1;
  int iVar2;
  I32 IVar3;
  laszip_I32 lVar4;
  FILE *__stream;
  undefined8 *puVar5;
  LASquadtree *this;
  LASindex *this_00;
  char *pcVar6;
  ulong uVar7;
  undefined4 uVar8;
  LASzip laszip;
  LASzip local_70;
  
  if (pointer != (laszip_POINTER)0x0) {
    if (file_name == (laszip_CHAR *)0x0) {
      builtin_strncpy((char *)((long)pointer + 600),"ter \'fil",8);
      builtin_strncpy((char *)((long)pointer + 0x260),"e_name\' ",8);
      builtin_strncpy((char *)((long)pointer + 0x248),"laszip_C",8);
      builtin_strncpy((char *)((long)pointer + 0x250),"HAR poin",8);
      *(undefined8 *)((long)pointer + 0x268) = 0x6f72657a207369;
    }
    else {
      if (*(long *)((long)pointer + 0x228) == 0) {
        if (*(long *)((long)pointer + 0x238) == 0) {
          __stream = (FILE *)LASfopen(file_name,"wb");
          *(FILE **)((long)pointer + 0x218) = __stream;
          if (__stream == (FILE *)0x0) {
            snprintf((char *)((long)pointer + 0x248),0x400,"cannot open file \'%s\'",file_name);
            return 1;
          }
          iVar2 = setvbuf(__stream,(char *)0x0,0,0x40000);
          if (iVar2 != 0) {
            builtin_strncpy((char *)((long)pointer + 0x662),"er size ",8);
            builtin_strncpy((char *)((long)pointer + 0x66a),"262144\n",8);
            builtin_strncpy((char *)((long)pointer + 0x658)," with bu",8);
            builtin_strncpy((char *)((long)pointer + 0x660),"ffer siz",8);
            builtin_strncpy((char *)((long)pointer + 0x648),"setvbuf(",8);
            builtin_strncpy((char *)((long)pointer + 0x650),") failed",8);
          }
          puVar5 = (undefined8 *)operator_new(0x28);
          uVar1 = *(undefined8 *)((long)pointer + 0x218);
          puVar5[1] = 0;
          *(undefined4 *)(puVar5 + 2) = 0;
          puVar5[3] = uVar1;
          *puVar5 = &PTR_putByte_0015e3f0;
          puVar5[4] = 0;
          *(undefined8 **)((long)pointer + 0x230) = puVar5;
          LASzip::LASzip(&local_70);
          IVar3 = setup_laszip_items((laszip_dll_struct *)pointer,&local_70,compress);
          if ((((IVar3 == 0) &&
               (IVar3 = laszip_prepare_header_for_write((laszip_dll_struct *)pointer), IVar3 == 0))
              && (IVar3 = laszip_prepare_point_for_write((laszip_dll_struct *)pointer,compress),
                 IVar3 == 0)) &&
             (((IVar3 = laszip_prepare_vlrs_for_write((laszip_dll_struct *)pointer), IVar3 == 0 &&
               (IVar3 = laszip_write_header((laszip_dll_struct *)pointer,&local_70,compress),
               IVar3 == 0)) &&
              (lVar4 = create_point_writer((laszip_dll_struct *)pointer,&local_70), lVar4 == 0)))) {
            if (*(char *)((long)pointer + 0xa78) == '\x01') {
              this = (LASquadtree *)operator_new(0xa8);
              LASquadtree::LASquadtree(this);
              LASquadtree::setup(this,*(F64 *)((long)pointer + 0xb8),*(F64 *)((long)pointer + 0xb0),
                                 *(F64 *)((long)pointer + 200),*(F64 *)((long)pointer + 0xc0),100.0)
              ;
              this_00 = (LASindex *)operator_new(0x30);
              LASindex::LASindex(this_00);
              *(LASindex **)((long)pointer + 0xa48) = this_00;
              LASindex::prepare(this_00,this,1000);
              pcVar6 = strdup(file_name);
              *(char **)((long)pointer + 0xa70) = pcVar6;
            }
            uVar7 = (ulong)*(uint *)((long)pointer + 0x68);
            if (uVar7 == 0) {
              uVar7 = *(ulong *)((long)pointer + 0xf8);
            }
            *(ulong *)((long)pointer + 0x1a8) = uVar7;
            *(undefined8 *)((long)pointer + 0x1a0) = 0;
            LASzip::~LASzip(&local_70);
            *(undefined1 *)((long)pointer + 0x248) = 0;
            return 0;
          }
          LASzip::~LASzip(&local_70);
          return 1;
        }
        uVar8._0_1_ = 'w';
        uVar8._1_1_ = 'r';
        uVar8._2_1_ = 'i';
        uVar8._3_1_ = 't';
      }
      else {
        uVar8._0_1_ = 'r';
        uVar8._1_1_ = 'e';
        uVar8._2_1_ = 'a';
        uVar8._3_1_ = 'd';
      }
      *(undefined4 *)((long)pointer + 0x248) = uVar8;
      builtin_strncpy((char *)((long)pointer + 0x24c),"er i",4);
      builtin_strncpy((char *)((long)pointer + 0x250),"s al",4);
      builtin_strncpy((char *)((long)pointer + 0x254),"read",4);
      *(undefined8 *)((long)pointer + 599) = 0x6e65706f207964;
    }
  }
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_open_writer(
    laszip_POINTER                     pointer
    , const laszip_CHAR*               file_name
    , laszip_BOOL                      compress
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (file_name == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_CHAR pointer 'file_name' is zero");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reader is already open");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writer is already open");
      return 1;
    }

    // open the file

    laszip_dll->file = LASfopen(file_name, "wb");

    if (laszip_dll->file == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot open file '%s'", file_name);
      return 1;
    }

    if (setvbuf(laszip_dll->file, NULL, _IOFBF, 262144) != 0)
    {
      snprintf(laszip_dll->warning, sizeof(laszip_dll->warning), "setvbuf() failed with buffer size 262144\n");
    }

    // create the outstream

    if (IS_LITTLE_ENDIAN())
      laszip_dll->streamout = new ByteStreamOutFileLE(laszip_dll->file);
    else
      laszip_dll->streamout = new ByteStreamOutFileBE(laszip_dll->file);

    if (laszip_dll->streamout == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "could not alloc ByteStreamOutFile");
      return 1;
    }

    // setup the items that make up the point

    LASzip laszip;
    if (setup_laszip_items(laszip_dll, &laszip, compress))
    {
      return 1;
    }

    // prepare header

    if (laszip_prepare_header_for_write(laszip_dll))
    {
      return 1;
    }

    // prepare point

    if (laszip_prepare_point_for_write(laszip_dll, compress))
    {
      return 1;
    }

    // prepare VLRs

    if (laszip_prepare_vlrs_for_write(laszip_dll))
    {
      return 1;
    }

    // write header variable after variable

    if (laszip_write_header(laszip_dll, &laszip, compress))
    {
      return 1;
    }

    // create the point writer

    if (create_point_writer(laszip_dll, &laszip))
    {
      return 1;
    }

    if (laszip_dll->lax_create)
    {
      // create spatial indexing information using cell_size = 100.0f and threshold = 1000

      LASquadtree* lasquadtree = new LASquadtree;
      lasquadtree->setup(laszip_dll->header.min_x, laszip_dll->header.max_x, laszip_dll->header.min_y, laszip_dll->header.max_y, 100.0f);

      laszip_dll->lax_index = new LASindex;
      laszip_dll->lax_index->prepare(lasquadtree, 1000);

      // copy the file name for later

      laszip_dll->lax_file_name = LASCopyString(file_name);
    }

    // set the point number and point count

    laszip_dll->npoints = (laszip_dll->header.number_of_point_records ? laszip_dll->header.number_of_point_records : laszip_dll->header.extended_number_of_point_records);
    laszip_dll->p_count = 0;
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_open_writer '%s'", file_name);
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}